

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::AutoFill
          (TPZBlockDiagonal<std::complex<double>_> *this,int64_t neq,int64_t jeq,int symmetric)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  complex<double> *pcVar4;
  double dVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  TPZStack<int,_10> blsizes;
  double local_c8;
  long local_c0;
  long local_b0;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    for (lVar10 = 0; lVar16 = neq - lVar10, lVar16 != 0 && lVar10 <= neq; lVar10 = lVar10 + lVar16)
    {
      iVar7 = rand();
      lVar8 = (iVar7 * neq) / 0x7fffffff;
      if (lVar8 < lVar16) {
        lVar16 = lVar8;
      }
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar16);
    }
    Initialize(this,&local_78.super_TPZVec<int>);
    lVar10 = (this->fBlockSize).fNElements;
    lVar16 = 0;
    if (lVar10 < 1) {
      lVar10 = lVar16;
    }
    for (; lVar16 != lVar10; lVar16 = lVar16 + 1) {
      lVar11 = (long)(this->fBlockSize).fStore[lVar16];
      lVar8 = 0;
      if (0 < lVar11) {
        lVar8 = lVar11;
      }
      lVar3 = (this->fBlockPos).fStore[lVar16];
      local_c0 = lVar3 * 0x10;
      lVar12 = lVar11 * 0x10;
      lVar9 = local_c0 + 8;
      local_b0 = local_c0;
      for (lVar15 = 0; lVar15 != lVar8; lVar15 = lVar15 + 1) {
        if (symmetric == 1) {
          local_c8 = 0.0;
          lVar13 = lVar15;
          lVar17 = local_b0;
          lVar18 = local_c0;
          while (bVar19 = lVar13 != 0, lVar13 = lVar13 + -1, lVar14 = lVar15, bVar19) {
            pcVar4 = (this->fStorage).fStore;
            puVar1 = (undefined8 *)(pcVar4->_M_value + lVar17);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)(pcVar4->_M_value + lVar18);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            in_XMM1_Qa = fabs(*(double *)(((this->fStorage).fStore)->_M_value + lVar17));
            in_XMM1_Qa = local_c8 + in_XMM1_Qa;
            lVar17 = lVar17 + 0x10;
            lVar18 = lVar18 + lVar12;
            local_c8 = in_XMM1_Qa;
          }
        }
        else {
          local_c8 = 0.0;
          lVar14 = 0;
        }
        lVar13 = lVar9 + lVar12 * lVar14;
        lVar17 = lVar12 * lVar14 + local_c0;
        for (; lVar14 < lVar11; lVar14 = lVar14 + 1) {
          TPZMatrix<std::complex<double>_>::GetRandomVal
                    (&this->super_TPZMatrix<std::complex<double>_>);
          pcVar4 = (this->fStorage).fStore;
          *(ulong *)(pcVar4->_M_value + lVar17) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          *(double *)(pcVar4->_M_value + lVar13) = in_XMM1_Qa;
          if (lVar15 != lVar14) {
            in_XMM1_Qa = fabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            in_XMM1_Qa = local_c8 + in_XMM1_Qa;
            local_c8 = in_XMM1_Qa;
          }
          lVar13 = lVar13 + lVar12;
          lVar17 = lVar17 + lVar12;
        }
        lVar14 = lVar15 * lVar11 + lVar3 + lVar15;
        dVar5 = fabs(*(double *)(this->fStorage).fStore[lVar14]._M_value);
        if (dVar5 < local_c8) {
          local_c8 = local_c8 + 1.0;
          pcVar4 = (this->fStorage).fStore;
          *(double *)pcVar4[lVar14]._M_value = local_c8;
          *(undefined8 *)(pcVar4[lVar14]._M_value + 8) = 0;
        }
        local_b0 = local_b0 + lVar12;
        local_c0 = local_c0 + 0x10;
        lVar9 = lVar9 + 0x10;
        in_XMM1_Qa = local_c8;
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}